

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::WriteEnumValueDocComment
          (java *this,Printer *printer,EnumValueDescriptor *value,Options *options)

{
  Options options_00;
  bool bVar1;
  string_view text;
  string_view text_00;
  string_view input;
  SourceLocation location;
  undefined4 uVar2;
  undefined2 uVar3;
  undefined2 in_stack_fffffffffffffeae;
  undefined1 *puVar4;
  long in_stack_fffffffffffffeb8;
  long in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined1 *puVar5;
  long in_stack_fffffffffffffed8;
  long in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined2 uVar6;
  undefined2 in_stack_fffffffffffffef2;
  undefined4 in_stack_fffffffffffffef4;
  undefined1 local_108 [8];
  java *local_100;
  undefined1 local_f8 [24];
  long *local_e0 [2];
  long local_d0 [2];
  undefined2 local_c0;
  string local_b8;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>((Printer *)this,text);
  uVar3 = (undefined2)value->number_;
  uVar2._0_1_ = value->super_SymbolBaseN<0>;
  uVar2._1_1_ = value->super_SymbolBaseN<1>;
  uVar2._2_2_ = *(undefined2 *)&value->field_0x2;
  puVar4 = &stack0xfffffffffffffec0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffeb0,value->all_names_,
             &value->type_->super_SymbolBase + (long)&(value->all_names_->_M_dataplus)._M_p);
  puVar5 = &stack0xfffffffffffffee0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffed0,value->merged_features_,
             (long)&(value->merged_features_->super_Message).super_MessageLite._vptr_MessageLite +
             *(long *)(value + 1));
  uVar6 = *(undefined2 *)&value[1].options_;
  local_98._24_8_ = 0;
  local_78._M_local_buf[0] = '\0';
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._16_8_ = &local_78;
  local_68._M_p = (pointer)&local_58;
  bVar1 = EnumValueDescriptor::GetSourceLocation
                    ((EnumValueDescriptor *)printer,(SourceLocation *)local_98);
  if (bVar1) {
    local_108._0_4_ = uVar2;
    local_108._4_2_ = uVar3;
    local_100 = (java *)(local_f8 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,puVar4,puVar4 + in_stack_fffffffffffffeb8);
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,puVar5,puVar5 + in_stack_fffffffffffffed8);
    options = (Options *)0x0;
    options_00.opensource_runtime = (bool)(char)uVar3;
    options_00.annotate_code = (bool)(char)((ushort)uVar3 >> 8);
    options_00.generate_immutable_code = (bool)(char)uVar2;
    options_00.generate_mutable_code = (bool)(char)((uint)uVar2 >> 8);
    options_00.generate_shared_code = (bool)(char)((uint)uVar2 >> 0x10);
    options_00.enforce_lite = (bool)(char)((uint)uVar2 >> 0x18);
    options_00._6_2_ = in_stack_fffffffffffffeae;
    options_00.annotation_list_file._M_dataplus._M_p = puVar4;
    options_00.annotation_list_file._M_string_length = in_stack_fffffffffffffeb8;
    options_00.annotation_list_file.field_2._M_allocated_capacity = in_stack_fffffffffffffec0;
    options_00.annotation_list_file.field_2._8_8_ = in_stack_fffffffffffffec8;
    options_00.output_list_file._M_dataplus._M_p = puVar5;
    options_00.output_list_file._M_string_length = in_stack_fffffffffffffed8;
    options_00.output_list_file.field_2._M_allocated_capacity = in_stack_fffffffffffffee0;
    options_00.output_list_file.field_2._8_8_ = in_stack_fffffffffffffee8;
    options_00.strip_nonfunctional_codegen = (bool)(char)uVar6;
    options_00.jvm_dsl = (bool)(char)((ushort)uVar6 >> 8);
    options_00._74_2_ = in_stack_fffffffffffffef2;
    options_00._76_4_ = in_stack_fffffffffffffef4;
    local_c0 = uVar6;
    WriteDocCommentBodyForLocation
              ((Printer *)this,(SourceLocation *)local_98,options_00,SUB21(uVar6,0));
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
    if (local_100 != (java *)(local_f8 + 8)) {
      operator_delete(local_100,local_f8._8_8_ + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,
                    CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._16_8_ != &local_78) {
    operator_delete((void *)local_98._16_8_,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  if (puVar5 != &stack0xfffffffffffffee0) {
    operator_delete(puVar5,in_stack_fffffffffffffee0 + 1);
  }
  if (puVar4 != &stack0xfffffffffffffec0) {
    operator_delete(puVar4,in_stack_fffffffffffffec0 + 1);
  }
  EnumValueDescriptor::DebugString_abi_cxx11_(&local_b8,(EnumValueDescriptor *)printer);
  FirstLineOf((string *)local_108,(java *)local_b8._M_dataplus._M_p,
              (string *)local_b8._M_string_length);
  input._M_len._4_2_ = local_108._4_2_;
  input._M_len._0_4_ = local_108._0_4_;
  input._M_len._6_2_ = local_108._6_2_;
  input._M_str = &options->generate_immutable_code;
  EscapeJavadoc_abi_cxx11_((string *)local_98,local_100,input);
  text_00._M_str = " * <code>$def$</code>\n */\n";
  text_00._M_len = 0x1a;
  io::Printer::Print<char[4],std::__cxx11::string>
            ((Printer *)this,text_00,(char (*) [4])0x128a3e4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  puVar4 = (undefined1 *)CONCAT26(local_108._6_2_,CONCAT24(local_108._4_2_,local_108._0_4_));
  if (puVar4 != local_f8) {
    operator_delete(puVar4,local_f8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WriteEnumValueDocComment(io::Printer* printer,
                              const EnumValueDescriptor* value,
                              const Options options) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, value, options, /* kdoc */ false);

  printer->Print(
      " * <code>$def$</code>\n"
      " */\n",
      "def", EscapeJavadoc(FirstLineOf(value->DebugString())));
}